

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper_functions.h
# Opt level: O1

bool read_landmark_data(string *filename,
                       vector<LandmarkObs,_std::allocator<LandmarkObs>_> *observations)

{
  pointer *ppLVar1;
  uint uVar2;
  iterator __position;
  char cVar3;
  istream *piVar4;
  double local_y;
  double local_x;
  LandmarkObs meas;
  string line_obs;
  istringstream iss_obs;
  ifstream in_file_obs;
  double local_400;
  double local_3f8;
  LandmarkObs local_3f0;
  undefined1 *local_3d8;
  undefined8 local_3d0;
  undefined1 local_3c8 [16];
  istringstream local_3b8 [120];
  ios_base local_340 [264];
  long local_238 [4];
  uint auStack_218 [122];
  
  std::ifstream::ifstream((istream *)local_238,(filename->_M_dataplus)._M_p,_S_in);
  uVar2 = *(uint *)((long)auStack_218 + *(long *)(local_238[0] + -0x18));
  if ((uVar2 & 5) == 0) {
    local_3d8 = local_3c8;
    local_3d0 = 0;
    local_3c8[0] = 0;
    while( true ) {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_3d8,cVar3);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::istringstream::istringstream(local_3b8,(string *)&local_3d8,_S_in);
      std::istream::_M_extract<double>((double *)local_3b8);
      std::istream::_M_extract<double>((double *)local_3b8);
      __position._M_current =
           (observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<LandmarkObs,std::allocator<LandmarkObs>>::_M_realloc_insert<LandmarkObs_const&>
                  ((vector<LandmarkObs,std::allocator<LandmarkObs>> *)observations,__position,
                   &local_3f0);
      }
      else {
        (__position._M_current)->y = local_400;
        (__position._M_current)->id = local_3f0.id;
        *(undefined4 *)&(__position._M_current)->field_0x4 = local_3f0._4_4_;
        (__position._M_current)->x = local_3f8;
        ppLVar1 = &(observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppLVar1 = *ppLVar1 + 1;
      }
      std::__cxx11::istringstream::~istringstream(local_3b8);
      std::ios_base::~ios_base(local_340);
    }
    if (local_3d8 != local_3c8) {
      operator_delete(local_3d8);
    }
  }
  std::ifstream::~ifstream(local_238);
  return (uVar2 & 5) == 0;
}

Assistant:

inline bool read_landmark_data(const std::string& filename, std::vector<LandmarkObs>& observations) {

	// Get file of landmark measurements:
	std::ifstream in_file_obs(filename.c_str(),std::ifstream::in);
	// Return if we can't open the file.
	if (!in_file_obs) {
		return false;
	}

	// Declare single line of landmark measurement file:
	std::string line_obs;

	// Run over each single line:
	while(getline(in_file_obs, line_obs)){

		std::istringstream iss_obs(line_obs);

		// Declare position values:
		double local_x, local_y;

		//read data from line to values:
		iss_obs >> local_x;
		iss_obs >> local_y;

		// Declare single landmark measurement:
		LandmarkObs meas;

		// Set values
		meas.x = local_x;
		meas.y = local_y;

		// Add to list of control measurements:
		observations.push_back(meas);
	}
	return true;
}